

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::Disk::readFrom(Disk *this,BinaryReader *binary)

{
  Shape::readFrom(&this->super_Shape,binary);
  BinaryReader::read<float,void>(binary,&this->radius);
  BinaryReader::read<float,void>(binary,&this->height);
  BinaryReader::read<pbrt::math::affine3f,void>(binary,&this->transform);
  return;
}

Assistant:

void Disk::readFrom(BinaryReader &binary) 
  {
    Shape::readFrom(binary);
    binary.read(radius);
    binary.read(height);
    binary.read(transform);
  }